

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O0

void wallet::coinselector_tests::srd_tests_invoker(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_wrap_stringstream<char> *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  long in_FS_OFFSET;
  basic_wrap_stringstream<char> *in_stack_ffffffffffffece8;
  std_string *in_stack_ffffffffffffecf0;
  basic_wrap_stringstream<char> *in_stack_ffffffffffffecf8;
  const_string *in_stack_ffffffffffffed10;
  size_t in_stack_ffffffffffffed18;
  undefined1 *__s;
  const_string *in_stack_ffffffffffffed20;
  const_string *file;
  unit_test_log_t *in_stack_ffffffffffffed28;
  srd_tests *in_stack_ffffffffffffee28;
  undefined1 local_1140 [320];
  undefined8 local_1000;
  undefined1 local_fa8 [408];
  undefined1 local_e10 [408];
  undefined1 local_c78 [408];
  srd_tests t;
  undefined1 local_1a0 [408];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecf8,
             (pointer)in_stack_ffffffffffffecf0,(unsigned_long)in_stack_ffffffffffffece8);
  memset(local_1a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_ffffffffffffece8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_ffffffffffffece8);
  boost::operator<<(in_stack_ffffffffffffecf8,(char *)in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [10])in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [15])in_stack_ffffffffffffecf0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_ffffffffffffecf8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecf8,in_stack_ffffffffffffecf0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_ffffffffffffed28,in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
             in_stack_ffffffffffffed10);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_ffffffffffffece8);
  srd_tests::srd_tests((srd_tests *)in_stack_ffffffffffffece8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecf8,
             (pointer)in_stack_ffffffffffffecf0,(unsigned_long)in_stack_ffffffffffffece8);
  memset(local_c78,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_ffffffffffffece8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_ffffffffffffece8);
  boost::operator<<(in_stack_ffffffffffffecf8,(char *)in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [10])in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [16])in_stack_ffffffffffffecf0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_ffffffffffffecf8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecf8,in_stack_ffffffffffffecf0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_ffffffffffffed28,in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
             in_stack_ffffffffffffed10);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_ffffffffffffece8);
  boost::unit_test::setup_conditional<wallet::coinselector_tests::srd_tests>((srd_tests *)0xd71b2f);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecf8,
             (pointer)in_stack_ffffffffffffecf0,(unsigned_long)in_stack_ffffffffffffece8);
  memset(local_e10,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_ffffffffffffece8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_ffffffffffffece8);
  boost::operator<<(in_stack_ffffffffffffecf8,(char *)in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [10])in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [13])in_stack_ffffffffffffecf0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_ffffffffffffecf8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecf8,in_stack_ffffffffffffecf0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_ffffffffffffed28,in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
             in_stack_ffffffffffffed10);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_ffffffffffffece8);
  srd_tests::test_method(in_stack_ffffffffffffee28);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecf8,
             (pointer)in_stack_ffffffffffffecf0,(unsigned_long)in_stack_ffffffffffffece8);
  memset(local_fa8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_ffffffffffffece8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_ffffffffffffece8);
  boost::operator<<(in_stack_ffffffffffffecf8,(char *)in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [10])in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [19])in_stack_ffffffffffffecf0);
  this = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_ffffffffffffecf8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecf8,in_stack_ffffffffffffecf0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
             in_stack_ffffffffffffed10);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_ffffffffffffece8);
  boost::unit_test::teardown_conditional<wallet::coinselector_tests::srd_tests>
            ((srd_tests *)0xd71d5b);
  file = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecf8,
             (pointer)in_stack_ffffffffffffecf0,(unsigned_long)in_stack_ffffffffffffece8);
  __s = local_1140;
  memset(__s,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_ffffffffffffece8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_ffffffffffffece8);
  msg = boost::operator<<(in_stack_ffffffffffffecf8,(char *)in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [10])in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [15])in_stack_ffffffffffffecf0);
  this_00 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_ffffffffffffecf8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)this_00,in_stack_ffffffffffffecf0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,file,(size_t)__s,(const_string *)msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_ffffffffffffece8);
  srd_tests::~srd_tests((srd_tests *)in_stack_ffffffffffffece8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(srd_tests)
{
    // Test SRD:
    // 1) Insufficient funds, select all provided coins and fail.
    // 2) Exceeded max weight, coin selection always surpasses the max allowed weight.
    // 3) Select coins without surpassing the max weight (some coins surpasses the max allowed weight, some others not)

    FastRandomContext rand;
    CoinSelectionParams dummy_params{ // Only used to provide the 'avoid_partial' flag.
            rand,
            /*change_output_size=*/34,
            /*change_spend_size=*/68,
            /*min_change_target=*/CENT,
            /*effective_feerate=*/CFeeRate(0),
            /*long_term_feerate=*/CFeeRate(0),
            /*discard_feerate=*/CFeeRate(0),
            /*tx_noinputs_size=*/10 + 34, // static header size + output size
            /*avoid_partial=*/false,
    };

    {
        // #########################################################
        // 1) Insufficient funds, select all provided coins and fail
        // #########################################################
        CAmount target = 49.5L * COIN;
        int max_selection_weight = 10000; // high enough to not fail for this reason.
        const auto& res = SelectCoinsSRD(target, dummy_params, m_node, max_selection_weight, [&](CWallet& wallet) {
            CoinsResult available_coins;
            for (int j = 0; j < 10; ++j) {
                add_coin(available_coins, wallet, CAmount(1 * COIN));
                add_coin(available_coins, wallet, CAmount(2 * COIN));
            }
            return available_coins;
        });
        BOOST_CHECK(!res);
        BOOST_CHECK(util::ErrorString(res).empty()); // empty means "insufficient funds"
    }

    {
        // ###########################
        // 2) Test max weight exceeded
        // ###########################
        CAmount target = 49.5L * COIN;
        int max_selection_weight = 3000;
        const auto& res = SelectCoinsSRD(target, dummy_params, m_node, max_selection_weight, [&](CWallet& wallet) {
            CoinsResult available_coins;
            for (int j = 0; j < 10; ++j) {
                /* 10 × 1 BTC + 10 × 2 BTC = 30 BTC. 20 × 272 WU = 5440 WU */
                add_coin(available_coins, wallet, CAmount(1 * COIN), CFeeRate(0), 144, false, 0, true);
                add_coin(available_coins, wallet, CAmount(2 * COIN), CFeeRate(0), 144, false, 0, true);
            }
            return available_coins;
        });
        BOOST_CHECK(!res);
        BOOST_CHECK(util::ErrorString(res).original.find("The inputs size exceeds the maximum weight") != std::string::npos);
    }

    {
        // ################################################################################################################
        // 3) Test selection when some coins surpass the max allowed weight while others not. --> must find a good solution
        // ################################################################################################################
        CAmount target = 25.33L * COIN;
        int max_selection_weight = 10000; // WU
        const auto& res = SelectCoinsSRD(target, dummy_params, m_node, max_selection_weight, [&](CWallet& wallet) {
            CoinsResult available_coins;
            for (int j = 0; j < 60; ++j) { // 60 UTXO --> 19,8 BTC total --> 60 × 272 WU = 16320 WU
                add_coin(available_coins, wallet, CAmount(0.33 * COIN), CFeeRate(0), 144, false, 0, true);
            }
            for (int i = 0; i < 10; i++) { // 10 UTXO --> 20 BTC total --> 10 × 272 WU = 2720 WU
                add_coin(available_coins, wallet, CAmount(2 * COIN), CFeeRate(0), 144, false, 0, true);
            }
            return available_coins;
        });
        BOOST_CHECK(res);
    }
}